

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_abs<unsigned_int>(uint length)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 *local_20;
  shared_ptr<unsigned_int> pv;
  
  iVar1 = posix_memalign(&local_20,0x40,(long)(int)length << 2);
  if (iVar1 != 0) {
    local_20 = (undefined4 *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,void(*)(unsigned_int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,local_20,
             sse::common::free<unsigned_int>);
  if (0 < (int)length) {
    lVar3 = 0;
    puVar2 = local_20;
    do {
      *puVar2 = (int)lVar3;
      lVar3 = lVar3 + -1;
      puVar2 = puVar2 + 1;
    } while (-lVar3 != (ulong)length);
  }
  if (pv.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}